

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O1

int nghttp2_session_on_push_promise_received(nghttp2_session *session,nghttp2_frame *frame)

{
  uint uVar1;
  nghttp2_on_begin_headers_callback p_Var2;
  int iVar3;
  int iVar4;
  nghttp2_stream *pnVar5;
  char *reason;
  nghttp2_priority_spec pri_spec;
  nghttp2_priority_spec local_2c;
  
  uVar1 = (frame->hd).stream_id;
  if (uVar1 == 0) {
    reason = "PUSH_PROMISE: stream_id == 0";
  }
  else if ((session->server == '\0') && ((session->local_settings).enable_push != 0)) {
    if ((uVar1 & 1) == 0) {
      reason = "PUSH_PROMISE: invalid stream_id";
    }
    else {
      if ((session->goaway_flags & 5) != 0) {
        return -0x67;
      }
      iVar4 = (frame->push_promise).promised_stream_id;
      if (((iVar4 != 0) == (bool)((byte)iVar4 & 1)) || (iVar4 <= session->last_recv_stream_id)) {
        reason = "PUSH_PROMISE: invalid promised_stream_id";
      }
      else {
        if ((int)uVar1 <= session->last_sent_stream_id) {
          session->last_recv_stream_id = iVar4;
          pnVar5 = nghttp2_session_get_stream(session,(frame->hd).stream_id);
          if ((((pnVar5 == (nghttp2_stream *)0x0) || (pnVar5->state == NGHTTP2_STREAM_CLOSING)) ||
              (session->pending_enable_push == '\0')) ||
             (session->max_incoming_reserved_streams <= session->num_incoming_reserved_streams)) {
            iVar4 = nghttp2_session_add_rst_stream
                              (session,(frame->push_promise).promised_stream_id,8);
            if (iVar4 == 0) {
              return -0x67;
            }
            return iVar4;
          }
          if ((pnVar5->shut_flags & 1) == 0) {
            nghttp2_priority_spec_init(&local_2c,pnVar5->stream_id,0x10,0);
            pnVar5 = nghttp2_session_open_stream
                               (session,(frame->push_promise).promised_stream_id,'\0',&local_2c,
                                NGHTTP2_STREAM_RESERVED,(void *)0x0);
            if (pnVar5 == (nghttp2_stream *)0x0) {
              return -0x385;
            }
            session->last_proc_stream_id = session->last_recv_stream_id;
            p_Var2 = (session->callbacks).on_begin_headers_callback;
            if (p_Var2 == (nghttp2_on_begin_headers_callback)0x0) {
              return 0;
            }
            iVar3 = (*p_Var2)(session,frame,session->user_data);
            iVar4 = -0x386;
            if (iVar3 == 0) {
              iVar4 = 0;
            }
            if (iVar3 != -0x209) {
              return iVar4;
            }
            return -0x209;
          }
          reason = "PUSH_PROMISE: stream closed";
          iVar4 = -0x1fe;
          goto LAB_0010da66;
        }
        reason = "PUSH_PROMISE: stream in idle";
      }
    }
  }
  else {
    reason = "PUSH_PROMISE: push disabled";
  }
  iVar4 = -0x1f9;
LAB_0010da66:
  iVar3 = session_handle_invalid_connection(session,frame,iVar4,reason);
  iVar4 = -0x67;
  if (iVar3 < -900) {
    iVar4 = iVar3;
  }
  return iVar4;
}

Assistant:

int nghttp2_session_on_push_promise_received(nghttp2_session *session,
                                             nghttp2_frame *frame) {
  int rv;
  nghttp2_stream *stream;
  nghttp2_stream *promised_stream;
  nghttp2_priority_spec pri_spec;

  if (frame->hd.stream_id == 0) {
    return session_inflate_handle_invalid_connection(
      session, frame, NGHTTP2_ERR_PROTO, "PUSH_PROMISE: stream_id == 0");
  }
  if (session->server || session->local_settings.enable_push == 0) {
    return session_inflate_handle_invalid_connection(
      session, frame, NGHTTP2_ERR_PROTO, "PUSH_PROMISE: push disabled");
  }

  if (!nghttp2_session_is_my_stream_id(session, frame->hd.stream_id)) {
    return session_inflate_handle_invalid_connection(
      session, frame, NGHTTP2_ERR_PROTO, "PUSH_PROMISE: invalid stream_id");
  }

  if (!session_allow_incoming_new_stream(session)) {
    /* We just discard PUSH_PROMISE after GOAWAY was sent */
    return NGHTTP2_ERR_IGN_HEADER_BLOCK;
  }

  if (!session_is_new_peer_stream_id(session,
                                     frame->push_promise.promised_stream_id)) {
    /* The spec says if an endpoint receives a PUSH_PROMISE with
       illegal stream ID is subject to a connection error of type
       PROTOCOL_ERROR. */
    return session_inflate_handle_invalid_connection(
      session, frame, NGHTTP2_ERR_PROTO,
      "PUSH_PROMISE: invalid promised_stream_id");
  }

  if (session_detect_idle_stream(session, frame->hd.stream_id)) {
    return session_inflate_handle_invalid_connection(
      session, frame, NGHTTP2_ERR_PROTO, "PUSH_PROMISE: stream in idle");
  }

  session->last_recv_stream_id = frame->push_promise.promised_stream_id;
  stream = nghttp2_session_get_stream(session, frame->hd.stream_id);
  if (!stream || stream->state == NGHTTP2_STREAM_CLOSING ||
      !session->pending_enable_push ||
      session->num_incoming_reserved_streams >=
        session->max_incoming_reserved_streams) {
    /* Currently, client does not retain closed stream, so we don't
       check NGHTTP2_SHUT_RD condition here. */

    rv = nghttp2_session_add_rst_stream(
      session, frame->push_promise.promised_stream_id, NGHTTP2_CANCEL);
    if (rv != 0) {
      return rv;
    }
    return NGHTTP2_ERR_IGN_HEADER_BLOCK;
  }

  if (stream->shut_flags & NGHTTP2_SHUT_RD) {
    return session_inflate_handle_invalid_connection(
      session, frame, NGHTTP2_ERR_STREAM_CLOSED, "PUSH_PROMISE: stream closed");
  }

  nghttp2_priority_spec_init(&pri_spec, stream->stream_id,
                             NGHTTP2_DEFAULT_WEIGHT, 0);

  promised_stream = nghttp2_session_open_stream(
    session, frame->push_promise.promised_stream_id, NGHTTP2_STREAM_FLAG_NONE,
    &pri_spec, NGHTTP2_STREAM_RESERVED, NULL);

  if (!promised_stream) {
    return NGHTTP2_ERR_NOMEM;
  }

  /* We don't call nghttp2_session_adjust_closed_stream(), since we
     don't keep closed stream in client side */

  session->last_proc_stream_id = session->last_recv_stream_id;
  rv = session_call_on_begin_headers(session, frame);
  if (rv != 0) {
    return rv;
  }
  return 0;
}